

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O1

int map_contains_any_cb_iterate(map m,map_key key,map_value value,map_cb_iterate_args args)

{
  uint uVar1;
  
  uVar1 = map_contains(*args,key);
  *(uint *)((long)args + 8) = uVar1;
  return uVar1 ^ 1;
}

Assistant:

static int map_contains_any_cb_iterate(map m, map_key key, map_value value, map_cb_iterate_args args)
{
	map_contains_any_cb_iterator iterator = (map_contains_any_cb_iterator)args;

	(void)m;
	(void)value;

	iterator->result = map_contains(iterator->m, key);

	/* Stop iteration if we found an element */
	return !iterator->result;
}